

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGsContainer.cpp
# Opt level: O3

Lexeme * __thiscall CFGsContainer::nextToken(Lexeme *__return_storage_ptr__,CFGsContainer *this)

{
  int iVar1;
  char cVar2;
  uint __c;
  Type TVar3;
  char ch;
  char local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  
  __return_storage_ptr__->type = TKN_EOF;
  cVar2 = (char)__return_storage_ptr__ + '\b';
  local_40 = &(__return_storage_ptr__->token).field_2;
  (__return_storage_ptr__->token)._M_dataplus._M_p = (pointer)local_40;
  (__return_storage_ptr__->token)._M_string_length = 0;
  (__return_storage_ptr__->token).field_2._M_local_buf[0] = '\0';
LAB_00106843:
  __c = 0xffffffff;
  if (((&this->field_0x28)[*(long *)(*(long *)&this->m_input + -0x18)] & 2) == 0) {
    std::operator>>((istream *)&this->m_input,local_60);
    __c = (uint)local_60[0];
  }
  if (__c < 0x31) {
    if ((0x100002600U >> ((ulong)__c & 0x3f) & 1) != 0) goto LAB_00106843;
    if ((ulong)__c == 0x30) {
      std::__cxx11::string::push_back(cVar2);
      __return_storage_ptr__->type = TKN_NUMBER;
      (__return_storage_ptr__->data).addr = 0;
      goto LAB_00106843;
    }
  }
  if (__c - 0x31 < 9) {
    std::__cxx11::string::push_back(cVar2);
    __return_storage_ptr__->type = TKN_NUMBER;
  }
  else {
    iVar1 = isalpha(__c);
    if (iVar1 == 0) {
      if ((int)__c < 0x2d) {
        if (__c == 0x22) {
          __return_storage_ptr__->type = TKN_TEXT;
        }
        else if (__c != 0x23) {
          TVar3 = TKN_EOF;
          if (__c != 0xffffffff) {
LAB_00106cc8:
            TVar3 = TKN_INVALID_TOKEN;
          }
LAB_00106cce:
          __return_storage_ptr__->type = TVar3;
          return __return_storage_ptr__;
        }
      }
      else {
        if (0x39 < (int)__c) {
          if (__c == 0x3a) {
            TVar3 = TKN_COLON;
            std::__cxx11::string::push_back(cVar2);
            goto LAB_00106cce;
          }
          if (__c == 0x5d) {
            TVar3 = TKN_BRACKET_CLOSE;
            std::__cxx11::string::push_back(cVar2);
          }
          else {
            if (__c != 0x5b) goto LAB_00106cc8;
            TVar3 = TKN_BRACKET_OPEN;
            std::__cxx11::string::push_back(cVar2);
          }
          goto LAB_00106cce;
        }
        if (__c != 0x2d) goto LAB_00106cc8;
        std::__cxx11::string::push_back(cVar2);
      }
    }
    else {
      tolower(__c);
      std::__cxx11::string::push_back(cVar2);
    }
  }
  goto LAB_00106843;
}

Assistant:

CFGsContainer::Lexeme CFGsContainer::nextToken() {
	Lexeme lex;

    int state = 1;
    while (state != 9) {
        int c = nextChar(m_input);
        switch (state) {
            case 1:
            		if (c == ' ' || c == '\t' || c == '\r' || c == '\n') {
					state = 1;
				} else if (c == '0') {
					lex.token += (char) c;
					lex.type = Lexeme::TKN_NUMBER;
					lex.data.number = 0;
					state = 2;
				} else if (c >= '1' && c <= '9') {
					lex.token += (char) c;
					lex.type = Lexeme::TKN_NUMBER;
					state = 4;
				} else if (std::isalpha(c)) {
					lex.token += (char) std::tolower(c);
					state = 5;
				} else if (c == '[') {
					lex.token += (char) c;
					lex.type = Lexeme::TKN_BRACKET_OPEN;
					state = 9;
				} else if (c == ']') {
					lex.token += (char) c;
					lex.type = Lexeme::TKN_BRACKET_CLOSE;
					state = 9;
				} else if (c == ':') {
					lex.token += (char) c;
					lex.type = Lexeme::TKN_COLON;
					state = 9;
				} else if (c == '\"') {
					lex.type = Lexeme::TKN_TEXT;
					state = 6;
				} else if (c == '-') {
					lex.token += (char) c;
					state = 7;
				} else if (c == '#') {
					state = 8;
				} else if (c == -1) {
					lex.type = Lexeme::TKN_EOF;
					state = 9;
				} else {
					lex.type = Lexeme::TKN_INVALID_TOKEN;
					state = 9;
				}

				break;
            case 2:
				if (std::tolower(c) == 'x') {
					lex.token += (char) std::tolower(c);
					lex.type = Lexeme::TKN_ADDR;
					state = 3;
				} else {
					if (c != -1)
						m_input.putback(c);

					state = 9;
				}

            		break;
            case 3:
				if (std::isdigit(c) ||
					(std::tolower(c) >= 'a' && std::tolower(c) <= 'f')) {
					lex.token += (char) std::tolower(c);
					state = 3;
				} else {
					lex.data.addr = std::stoul(lex.token.substr(2), 0, 16);

					if (c != -1)
						m_input.putback(c);

					state = 9;
				}

            		break;
            case 4:
				if (std::isdigit(c)) {
					lex.token += (char) c;
					state = 4;
				} else {
					lex.data.number = std::stoull(lex.token);

					if (c != -1)
						m_input.putback(c);

					state = 9;
				}

            		break;
            case 5:
				if (std::isalpha(c)) {
					lex.token += (char) std::tolower(c);
					state = 5;
				} else {
					if (lex.token == "cfg") {
						lex.type = Lexeme::TKN_CFG;
					} else if (lex.token == "node") {
						lex.type = Lexeme::TKN_NODE;
					} else if (lex.token == "exit") {
						lex.type = Lexeme::TKN_EXIT;
					} else if (lex.token == "halt") {
						lex.type = Lexeme::TKN_HALT;
					} else if (lex.token == "true") {
						lex.type = Lexeme::TKN_BOOL;
						lex.data.boolean = true;
					} else if (lex.token == "false") {
						lex.type = Lexeme::TKN_BOOL;
						lex.data.boolean = false;
					} else {
						lex.type = Lexeme::TKN_INVALID_TOKEN;
					}

					if (c != -1)
						m_input.putback(c);

					state = 9;
				}

				break;
			case 6:
				if (c == -1) {
					lex.type = Lexeme::TKN_UNEXPECTED_EOF;
					state = 9;
				} else {
					if (c == '\"')
						state = 9;
					else {
						lex.token += (char) c;
						state = 6;
					}
				}

				break;
			case 7:
				if (c == -1) {
					lex.type = Lexeme::TKN_UNEXPECTED_EOF;
					state = 9;
				} else {
					if (c == '>') {
						lex.type = Lexeme::TKN_ARROW;
						lex.token += (char) c;
						state = 9;
					} else {
						lex.type = Lexeme::TKN_INVALID_TOKEN;
						state = 9;
					}
				}

				break;
			case 8:
				if (c == -1) {
					state = 9;
				} else {
					if (c == '\n')
						state = 1;
					else
						state = 8;
				}

				break;
			default:
				lex.type = Lexeme::TKN_INVALID_TOKEN;
				state = 9;
				break;
		}
	}

	return lex;
}